

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandGameMode::Tick
          (CommandGameMode *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  bool bVar1;
  int iVar2;
  bool local_32;
  bool local_31;
  bool hudChanged_local;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  CommandGameMode *this_local;
  
  SBarInfoCommandFlowControl::Tick
            (&this->super_SBarInfoCommandFlowControl,block,statusBar,hudChanged);
  if (((((multiplayer & 1U) != 0) ||
       (local_31 = true, (*(uint *)&(this->super_SBarInfoCommandFlowControl).field_0x34 & 1) == 0))
      && ((iVar2 = FIntCVar::operator_cast_to_int(&deathmatch), iVar2 == 0 ||
          (local_31 = true, (*(uint *)&(this->super_SBarInfoCommandFlowControl).field_0x34 & 4) == 0
          )))) &&
     ((((multiplayer & 1U) == 0 || (iVar2 = FIntCVar::operator_cast_to_int(&deathmatch), iVar2 != 0)
       ) || (local_31 = true,
            (*(uint *)&(this->super_SBarInfoCommandFlowControl).field_0x34 & 2) == 0)))) {
    bVar1 = FBoolCVar::operator_cast_to_bool(&teamplay);
    local_32 = false;
    if (bVar1) {
      local_32 = (*(uint *)&(this->super_SBarInfoCommandFlowControl).field_0x34 & 8) != 0;
    }
    local_31 = local_32;
  }
  SBarInfoCommandFlowControl::SetTruth
            (&this->super_SBarInfoCommandFlowControl,local_31,block,statusBar);
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoCommandFlowControl::Tick(block, statusBar, hudChanged);

			SetTruth((!multiplayer && (modes & SINGLEPLAYER)) ||
				(deathmatch && (modes & DEATHMATCH)) ||
				(multiplayer && !deathmatch && (modes & COOPERATIVE)) ||
				(teamplay && (modes & TEAMGAME)), block, statusBar);
		}